

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve-names.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_14::NameResolver::VisitElemSegment(NameResolver *this,ElemSegment *segment)

{
  bool bVar1;
  ExprType EVar2;
  reference this_00;
  size_type sVar3;
  reference pvVar4;
  VarExpr<(wabt::ExprType)36> *pVVar5;
  ExprList *elem_expr;
  iterator __end1;
  iterator __begin1;
  ExprListVector *__range1;
  ElemSegment *segment_local;
  NameResolver *this_local;
  
  ResolveTableVar(this,&segment->table_var);
  ExprVisitor::VisitExprList(&this->visitor_,&segment->offset);
  __end1 = std::
           vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
           ::begin(&segment->elem_exprs);
  elem_expr = (ExprList *)
              std::
              vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
              ::end(&segment->elem_exprs);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<wabt::intrusive_list<wabt::Expr>_*,_std::vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>_>
                                *)&elem_expr);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<wabt::intrusive_list<wabt::Expr>_*,_std::vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>_>
              ::operator*(&__end1);
    sVar3 = intrusive_list<wabt::Expr>::size(this_00);
    if (sVar3 == 1) {
      pvVar4 = intrusive_list<wabt::Expr>::front(this_00);
      EVar2 = Expr::type(pvVar4);
      if (EVar2 == RefFunc) {
        pvVar4 = intrusive_list<wabt::Expr>::front(this_00);
        pVVar5 = cast<wabt::VarExpr<(wabt::ExprType)36>,wabt::Expr>(pvVar4);
        ResolveFuncVar(this,&pVVar5->var);
      }
    }
    __gnu_cxx::
    __normal_iterator<wabt::intrusive_list<wabt::Expr>_*,_std::vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void NameResolver::VisitElemSegment(ElemSegment* segment) {
  ResolveTableVar(&segment->table_var);
  visitor_.VisitExprList(segment->offset);
  for (ExprList& elem_expr : segment->elem_exprs) {
    if (elem_expr.size() == 1 &&
        elem_expr.front().type() == ExprType::RefFunc) {
      ResolveFuncVar(&cast<RefFuncExpr>(&elem_expr.front())->var);
    }
  }
}